

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainMakefile2(cmGlobalUnixMakefileGenerator3 *this)

{
  __uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> this_00;
  pointer puVar1;
  Encoding encoding;
  string *a;
  _Base_ptr p_Var2;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen;
  pointer puVar3;
  allocator<char> local_319;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_commands;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
  local_2e0;
  string makefileName;
  cmGeneratedFileStream makefileStream;
  
  a = cmake::GetHomeOutputDirectory_abi_cxx11_
                ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[22]>
            (&makefileName,a,(char (*) [22])"/CMakeFiles/Makefile2");
  encoding = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
               [5])(this);
  cmGeneratedFileStream::cmGeneratedFileStream(&makefileStream,&makefileName,false,encoding);
  if (((&makefileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20
       )[(long)makefileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
               _vptr_basic_ostream[-3]] & 5) == 0) {
    this_00._M_t.super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
    super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl =
         (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t;
    cmLocalUnixMakefileGenerator3::WriteDisclaimer
              ((cmLocalUnixMakefileGenerator3 *)
               this_00._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,
               (ostream *)&makefileStream);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    no_commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    no_commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    no_commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
               (char (*) [4])0x709469);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"default_target",&local_319);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              ((cmLocalUnixMakefileGenerator3 *)
               this_00._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,
               (ostream *)&makefileStream,
               "Default target executed when no arguments are given to make.",(string *)&local_2e0,
               &depends,&no_commands,true,false);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&depends);
    if ((this->EmptyRuleHackDepends)._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&depends,&this->EmptyRuleHackDepends);
    }
    cmLocalUnixMakefileGenerator3::WriteSpecialTargetsTop
              ((cmLocalUnixMakefileGenerator3 *)
               this_00._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,
               (ostream *)&makefileStream);
    cmGlobalCommonGenerator::ComputeDirectoryTargets_abi_cxx11_
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
                *)&local_2e0,&this->super_cmGlobalCommonGenerator);
    for (p_Var2 = local_2e0._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &local_2e0._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      WriteDirectoryRules2
                (this,(ostream *)&makefileStream,
                 (cmLocalUnixMakefileGenerator3 *)
                 this_00._M_t.
                 super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                 super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,
                 (DirectoryTarget *)(p_Var2 + 2));
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalCommonGenerator::DirectoryTarget>_>_>
    ::~_Rb_tree(&local_2e0);
    puVar1 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar3 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                  super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1)
    {
      WriteConvenienceRules2
                (this,(ostream *)&makefileStream,
                 (cmLocalUnixMakefileGenerator3 *)
                 this_00._M_t.
                 super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                 super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,
                 (cmLocalUnixMakefileGenerator3 *)
                 (puVar3->_M_t).
                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                 super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
    }
    cmLocalUnixMakefileGenerator3::WriteSpecialTargetsBottom
              ((cmLocalUnixMakefileGenerator3 *)
               this_00._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,
               (ostream *)&makefileStream);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&no_commands);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depends);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&makefileStream);
  std::__cxx11::string::~string((string *)&makefileName);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainMakefile2()
{
  // Open the output file.  This should not be copy-if-different
  // because the check-build-system step compares the makefile time to
  // see if the build system must be regenerated.
  std::string makefileName =
    cmStrCat(this->GetCMakeInstance()->GetHomeOutputDirectory(),
             "/CMakeFiles/Makefile2");
  cmGeneratedFileStream makefileStream(makefileName, false,
                                       this->GetMakefileEncoding());
  if (!makefileStream) {
    return;
  }

  // The global dependency graph is expressed via the root local generator.
  auto& rootLG = cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(
    this->LocalGenerators[0]);

  // Write the do not edit header.
  rootLG.WriteDisclaimer(makefileStream);

  // Write the main entry point target.  This must be the VERY first
  // target so that make with no arguments will run it.
  // Just depend on the all target to drive the build.
  std::vector<std::string> depends;
  std::vector<std::string> no_commands;
  depends.emplace_back("all");

  // Write the rule.
  rootLG.WriteMakeRule(makefileStream,
                       "Default target executed when no arguments are "
                       "given to make.",
                       "default_target", depends, no_commands, true);

  depends.clear();

  // The all and preinstall rules might never have any dependencies
  // added to them.
  if (!this->EmptyRuleHackDepends.empty()) {
    depends.push_back(this->EmptyRuleHackDepends);
  }

  // Write out the "special" stuff
  rootLG.WriteSpecialTargetsTop(makefileStream);

  // Write the directory level rules.
  for (auto const& it : this->ComputeDirectoryTargets()) {
    this->WriteDirectoryRules2(makefileStream, rootLG, it.second);
  }

  // Write the target convenience rules
  for (const auto& localGen : this->LocalGenerators) {
    this->WriteConvenienceRules2(
      makefileStream, rootLG,
      cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(localGen));
  }

  // Write special bottom targets
  rootLG.WriteSpecialTargetsBottom(makefileStream);
}